

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::TextFlow::AnsiSkippingString::AnsiSkippingString(AnsiSkippingString *this,string *text)

{
  pointer pcVar1;
  
  (this->m_string)._M_dataplus._M_p = (pointer)&(this->m_string).field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + text->_M_string_length);
  this->m_size = 0;
  preprocessString(this);
  return;
}

Assistant:

AnsiSkippingString::AnsiSkippingString( std::string const& text ):
            m_string( text ) {
            preprocessString();
        }